

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  int iVar1;
  limitedOutput_directive outputDirective;
  tableType_t tableType;
  dictIssue_directive dictIssue;
  
  dictIssue = dictSmall;
  if (acceleration < 2) {
    acceleration = dictIssue;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  iVar1 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar1 = (uint)srcSize / 0xff + srcSize + 0x10;
  }
  if (iVar1 <= dstCapacity) {
    if (srcSize < 0x1000b) {
      LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU16);
      dictIssue = (dictIssue_directive)(*(int *)((long)state + 0x4010) != 0);
      tableType = byU16;
    }
    else {
      LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU32);
      dictIssue = noDictIssue;
      tableType = byU32;
    }
    outputDirective = notLimited;
    dstCapacity = 0;
    goto LAB_00dfc3b9;
  }
  if (srcSize < 0x1000b) {
    LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU16);
    if (*(int *)((long)state + 0x4010) == 0) {
      tableType = byU16;
      goto LAB_00dfc370;
    }
    tableType = byU16;
  }
  else {
    LZ4_prepareTable((LZ4_stream_t_internal *)state,srcSize,byU32);
    tableType = byU32;
LAB_00dfc370:
    dictIssue = noDictIssue;
  }
  outputDirective = limitedOutput;
LAB_00dfc3b9:
  iVar1 = LZ4_compress_generic
                    ((LZ4_stream_t_internal *)state,src,dst,srcSize,(int *)0x0,dstCapacity,
                     outputDirective,tableType,noDict,dictIssue,acceleration);
  return iVar1;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}